

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  ushort uVar2;
  _Base_ptr p_Var3;
  pointer pPVar4;
  pointer puVar5;
  int iVar6;
  P2PSocket *this;
  Events *pEVar7;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar8;
  Peers *pPVar9;
  ostream *poVar10;
  allocator_type *__a;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  int iVar12;
  pointer puVar13;
  pointer pPVar14;
  initializer_list<unsigned_short> __l;
  vector<unsigned_short,_std::allocator<unsigned_short>_> knownPorts;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> msgs;
  undefined1 local_198 [8];
  undefined1 local_190 [24];
  P2PSocket *local_178;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_170;
  _Base_ptr local_158;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> local_150;
  P2PSocket *local_138;
  undefined8 uStack_130;
  code *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  Event local_b0;
  Event local_70;
  
  local_198._0_2_ = 0x22ba;
  __a = (allocator_type *)&local_150;
  __l._M_len = 1;
  __l._M_array = (iterator)local_198;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_170,__l,__a);
  this = (P2PSocket *)operator_new(0xb0);
  P2PSocket::P2PSocket(this,2,false);
  local_198 = (undefined1  [8])(local_190 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"127.0.0.1","");
  P2PSocket::createServer(this,(string *)local_198,0x1a66);
  if (local_198 != (undefined1  [8])(local_190 + 8)) {
    operator_delete((void *)local_198,local_190._8_8_ + 1);
  }
  pEVar7 = P2PSocket::events(this);
  puVar8 = Events::onPeerConnect(pEVar7);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c0 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:28:9)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:28:9)>
             ::_M_manager;
  Event::listen(&local_70,
                (int)(puVar8->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_d8);
  std::vector<Callable,_std::allocator<Callable>_>::~vector(&local_70.m_listeners);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != &local_70.m_name.field_2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  pEVar7 = P2PSocket::events(this);
  puVar8 = Events::onPeerDisconnect(pEVar7);
  local_f8 = 0;
  uStack_f0 = 0;
  local_e0 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:30:9)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:30:9)>
             ::_M_manager;
  Event::listen(&local_b0,
                (int)(puVar8->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_f8);
  std::vector<Callable,_std::allocator<Callable>_>::~vector(&local_b0.m_listeners);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_name._M_dataplus._M_p != &local_b0.m_name.field_2) {
    operator_delete(local_b0.m_name._M_dataplus._M_p,
                    local_b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_158 = (_Base_ptr)
              ((ulong)((long)local_170.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_170.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 1);
  local_178 = this;
  signal(0xd,(__sighandler_t)0x1);
  pcVar1 = local_190 + 8;
  iVar12 = 0;
  uVar11 = extraout_RDX;
  do {
    P2PSocket::listen(local_178,0,(int)uVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"listening\n",10);
    puVar5 = local_170.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar13 = local_170.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar13 != puVar5;
        puVar13 = puVar13 + 1) {
      if (iVar12 < (int)local_158) {
        uVar2 = *puVar13;
        local_198 = (undefined1  [8])pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"127.0.0.1","");
        P2PSocket::connect(local_178,(int)local_198,(sockaddr *)(ulong)uVar2,(socklen_t)__a);
        if (local_198 != (undefined1  [8])pcVar1) {
          operator_delete((void *)local_198,local_190._8_8_ + 1);
        }
        iVar12 = iVar12 + 1;
      }
    }
    pPVar9 = P2PSocket::peers(local_178);
    iVar6 = Peers::count(pPVar9);
    if (0 < iVar6) {
      pPVar9 = P2PSocket::peers(local_178);
      local_198 = (undefined1  [8])pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Broadcasting...","");
      local_108 = (code *)0x0;
      uStack_100 = 0;
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      iVar6 = Peers::broadcast(pPVar9,(string *)local_198,
                               (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>
                                *)&local_118);
      if (local_108 != (code *)0x0) {
        (*local_108)(&local_118,&local_118,__destroy_functor);
      }
      if (local_198 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_198,local_190._8_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sent: ",6);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," msgs\n",6);
      pPVar9 = P2PSocket::peers(local_178);
      local_128 = (code *)0x0;
      uStack_120 = 0;
      local_138 = (P2PSocket *)0x0;
      uStack_130._0_4_ = 0;
      uStack_130._4_4_ = 0;
      __a = (allocator_type *)&local_138;
      Peers::read((Peers *)local_198,(int)pPVar9,(void *)0x400,(size_t)__a);
      PeersMessages::all(&local_150,(PeersMessages *)local_198);
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector
                ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)local_190);
      pPVar14 = local_150.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar4 = local_150.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_128 != (code *)0x0) {
        (*local_128)(&local_138,&local_138,3);
        pPVar14 = local_150.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar4 = local_150.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pPVar14 != pPVar4; pPVar14 = pPVar14 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Recieved message: ",0x12);
        p_Var3 = (_Base_ptr)(pPVar14->m_message)._M_dataplus._M_p;
        local_198 = (undefined1  [8])pcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,p_Var3,
                   (long)&p_Var3->_M_color +
                   (long)&((_Base_ptr)(pPVar14->m_message)._M_string_length)->_M_color);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_198,local_190._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," from ",6);
        Peer::port(pPVar14->m_peer);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if (local_198 != (undefined1  [8])pcVar1) {
          operator_delete((void *)local_198,local_190._8_8_ + 1);
        }
      }
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector(&local_150);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sleeping...",0xb);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    sleep(2);
    uVar11 = extraout_RDX_00;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    std::vector<uint16_t> knownPorts = {
        8890,
    };

    P2PSocket *sock;

    try {
        sock = new P2PSocket(2);
        sock->createServer("127.0.0.1", 6758);
    } catch(P2PSocketException &e) {
        std::cout << e.what() << std::endl;
    }

    sock->events()->onPeerConnect()->listen(
        [](auto &&) { std::cout << "A new peer connected" << std::endl; });
    sock->events()->onPeerDisconnect()->listen(
        [](auto &&) { std::cout << "A peer disconnected" << std::endl; });

    int total = knownPorts.size();
    int connected = 0;
    signal(SIGPIPE, SIG_IGN);

    while (true) {
        try {
            sock->listen();
            std::cout << "listening\n";
        } catch (const P2PSocketException &e) {
            // std::cout << e.what() << std::endl;
        }

        for (auto port : knownPorts) {
            if (connected < total) {
                try {
                    sock->connect("127.0.0.1", port);
                } catch (const P2PSocketException &e) {
                    std::cout << e.what();
                }
                ++connected;
            }
        }

        auto peersCount = sock->peers()->count();

        if (peersCount > 0) {
            try {
                int bytes = sock->peers()->broadcast("Broadcasting...");
                std::cout << "Sent: " << bytes << " msgs\n";
            } catch (...) {
            }
            try {
                auto msgs = sock->peers()->read().all();
                for (const auto &msg : msgs) {
                    std::cout << "Recieved message: " << msg.message() << " from "
                              << msg.peer()->port() << "\n";
                }
            } catch (const PeerException &e) {
                std::cout << "No messages\n";
            }
        }

        std::cout << "Sleeping..." << connected << "\n";
        sleep(2);
    }

    std::cout << "Done, exiting...\n";
    return 0;
}